

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynAccessor * ParseAccessorDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  int iVar2;
  int iVar3;
  SynBase *type;
  undefined4 extraout_var;
  Lexeme *pLVar4;
  Lexeme *pLVar5;
  SynBlock *getBlock;
  undefined4 extraout_var_00;
  SynIdentifier *this;
  SynBlock *setBlock;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *msg;
  InplaceStr IVar6;
  undefined4 extraout_var_01;
  
  begin = ctx->currentLexeme;
  type = ParseType(ctx,(bool *)0x0,false);
  if (type != (SynBase *)0x0) {
    bVar1 = anon_unknown.dwarf_1519a::CheckAt
                      (ctx,lex_string,"ERROR: class member name expected after type");
    if (bVar1) {
      IVar6 = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pLVar4 = ParseContext::Previous(ctx);
      pLVar5 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier
                ((SynIdentifier *)CONCAT44(extraout_var,iVar2),pLVar4,pLVar5,IVar6);
      if (ctx->currentLexeme->type == lex_ofigure) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        anon_unknown.dwarf_1519a::CheckConsume(ctx,(char *)pLVar4,msg);
        getBlock = ParseBlock(ctx);
        if (getBlock == (SynBlock *)0x0) {
          anon_unknown.dwarf_1519a::Report
                    (ctx,ctx->currentLexeme,"ERROR: function body expected after \'get\'");
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          getBlock = (SynBlock *)CONCAT44(extraout_var_00,iVar3);
          SynError::SynError((SynError *)getBlock,ctx->currentLexeme,ctx->currentLexeme);
        }
        bVar1 = ParseContext::Consume(ctx,"set");
        if (bVar1) {
          if (ctx->currentLexeme->type == lex_oparen) {
            ctx->currentLexeme = ctx->currentLexeme + 1;
            this = (SynIdentifier *)0x0;
            bVar1 = anon_unknown.dwarf_1519a::CheckAt
                              (ctx,lex_string,"ERROR: r-value name not found after \'(\'");
            if (bVar1) {
              IVar6 = ParseContext::Consume(ctx);
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
              this = (SynIdentifier *)CONCAT44(extraout_var_01,iVar3);
              pLVar4 = ParseContext::Previous(ctx);
              pLVar5 = ParseContext::Previous(ctx);
              SynIdentifier::SynIdentifier(this,pLVar4,pLVar5,IVar6);
            }
            anon_unknown.dwarf_1519a::CheckConsume
                      (ctx,lex_cparen,"ERROR: \')\' not found after r-value");
          }
          else {
            this = (SynIdentifier *)0x0;
          }
          setBlock = ParseBlock(ctx);
          if (setBlock == (SynBlock *)0x0) {
            anon_unknown.dwarf_1519a::Report
                      (ctx,ctx->currentLexeme,"ERROR: function body expected after \'set\'");
            iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            setBlock = (SynBlock *)CONCAT44(extraout_var_02,iVar3);
            SynError::SynError((SynError *)setBlock,ctx->currentLexeme,ctx->currentLexeme);
          }
        }
        else {
          this = (SynIdentifier *)0x0;
          setBlock = (SynBlock *)0x0;
        }
        anon_unknown.dwarf_1519a::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' is expected after property");
        anon_unknown.dwarf_1519a::CheckConsume
                  (ctx,lex_semicolon,"ERROR: \';\' not found after class member list");
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pLVar4 = ParseContext::Previous(ctx);
        SynAccessor::SynAccessor
                  ((SynAccessor *)CONCAT44(extraout_var_03,iVar3),begin,pLVar4,type,
                   (SynIdentifier *)CONCAT44(extraout_var,iVar2),&getBlock->super_SynBase,
                   &setBlock->super_SynBase,this);
        return (SynAccessor *)CONCAT44(extraout_var_03,iVar3);
      }
    }
    ctx->currentLexeme = begin;
  }
  return (SynAccessor *)0x0;
}

Assistant:

SynAccessor* ParseAccessorDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(SynBase *type = ParseType(ctx))
	{
		if(!CheckAt(ctx, lex_string, "ERROR: class member name expected after type"))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(!ctx.Consume(lex_ofigure))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, "get", "ERROR: 'get' is expected after '{'");

		SynBase *getBlock = ParseBlock(ctx);

		if(!getBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: function body expected after 'get'");

			getBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *setBlock = NULL;
		SynIdentifier *setNameIdentifier = NULL;

		if(ctx.Consume("set"))
		{
			if(ctx.Consume(lex_oparen))
			{
				if(CheckAt(ctx, lex_string, "ERROR: r-value name not found after '('"))
				{
					InplaceStr setName = ctx.Consume();
					setNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), setName);
				}

				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after r-value");
			}

			setBlock = ParseBlock(ctx);

			if(!setBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: function body expected after 'set'");

				setBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' is expected after property");

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");

		return new (ctx.get<SynAccessor>()) SynAccessor(start, ctx.Previous(), type, nameIdentifier, getBlock, setBlock, setNameIdentifier);
	}

	return NULL;
}